

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::GetFrustumBottomPlane(ON_Viewport *this,ON_Plane *bottom_plane)

{
  bool bVar1;
  byte local_f1;
  ON_3dVector local_f0;
  ON_3dPoint local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  undefined1 local_30 [8];
  ON_2dVector v;
  bool rc;
  ON_Plane *bottom_plane_local;
  ON_Viewport *this_local;
  
  local_f1 = 0;
  if ((this->m_bValidCamera & 1U) != 0) {
    local_f1 = this->m_bValidFrustum;
  }
  v.y._7_1_ = local_f1 & 1;
  if (v.y._7_1_ != 0) {
    bVar1 = IsPerspectiveProjection(this);
    if (bVar1) {
      ON_2dVector::ON_2dVector((ON_2dVector *)local_30,this->m_frus_near,this->m_frus_bottom);
      v.y._7_1_ = ON_2dVector::Unitize((ON_2dVector *)local_30);
      (bottom_plane->origin).x = (this->m_CamLoc).x;
      (bottom_plane->origin).y = (this->m_CamLoc).y;
      (bottom_plane->origin).z = (this->m_CamLoc).z;
      ::operator*(&local_60,-v.x,&this->m_CamY);
      ::operator*(&local_78,(double)local_30,&this->m_CamZ);
      ON_3dVector::operator+(&local_48,&local_60,&local_78);
      (bottom_plane->xaxis).x = local_48.x;
      (bottom_plane->xaxis).y = local_48.y;
      (bottom_plane->xaxis).z = local_48.z;
      (bottom_plane->yaxis).x = (this->m_CamX).x;
      (bottom_plane->yaxis).y = (this->m_CamX).y;
      (bottom_plane->yaxis).z = (this->m_CamX).z;
      ::operator*(&local_a8,(double)local_30,&this->m_CamY);
      ::operator*(&local_c0,v.x,&this->m_CamZ);
      ON_3dVector::operator+(&local_90,&local_a8,&local_c0);
      (bottom_plane->zaxis).x = local_90.x;
      (bottom_plane->zaxis).y = local_90.y;
      (bottom_plane->zaxis).z = local_90.z;
    }
    else {
      ::operator*(&local_f0,this->m_frus_bottom,&this->m_CamY);
      ON_3dPoint::operator+(&local_d8,&this->m_CamLoc,&local_f0);
      (bottom_plane->origin).x = local_d8.x;
      (bottom_plane->origin).y = local_d8.y;
      (bottom_plane->origin).z = local_d8.z;
      (bottom_plane->xaxis).x = (this->m_CamZ).x;
      (bottom_plane->xaxis).y = (this->m_CamZ).y;
      (bottom_plane->xaxis).z = (this->m_CamZ).z;
      (bottom_plane->yaxis).x = (this->m_CamX).x;
      (bottom_plane->yaxis).y = (this->m_CamX).y;
      (bottom_plane->yaxis).z = (this->m_CamX).z;
      (bottom_plane->zaxis).x = (this->m_CamY).x;
      (bottom_plane->zaxis).y = (this->m_CamY).y;
      (bottom_plane->zaxis).z = (this->m_CamY).z;
    }
    ON_Plane::UpdateEquation(bottom_plane);
  }
  return (bool)(v.y._7_1_ & 1);
}

Assistant:

bool ON_Viewport::GetFrustumBottomPlane( 
  ON_Plane& bottom_plane 
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {
    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_bottom);
      rc = v.Unitize();
      bottom_plane.origin = m_CamLoc;
      bottom_plane.xaxis = -v.y*m_CamY + v.x*m_CamZ;
      bottom_plane.yaxis =  m_CamX;
      bottom_plane.zaxis =  v.x*m_CamY + v.y*m_CamZ;
    }
    else
    {
      bottom_plane.origin = m_CamLoc + m_frus_bottom*m_CamY;
      bottom_plane.xaxis =  m_CamZ;
      bottom_plane.yaxis =  m_CamX;
      bottom_plane.zaxis =  m_CamY;
    }
    bottom_plane.UpdateEquation();
  }
  return rc;
}